

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound-core.c
# Opt level: O0

void close_sound(void)

{
  int local_c;
  wchar_t i;
  
  if (next_sound_id != 0) {
    if (hooks.unload_sound_hook != (_func__Bool_sound_data_ptr *)0x0) {
      for (local_c = 0; local_c < (int)(uint)next_sound_id; local_c = local_c + 1) {
        (*hooks.unload_sound_hook)(sounds + local_c);
        string_free(sounds[local_c].name);
      }
    }
    mem_free(sounds);
    sounds = (sound_data *)0x0;
    next_sound_id = 0;
    if (hooks.close_audio_hook != (_func__Bool *)0x0) {
      (*hooks.close_audio_hook)();
    }
  }
  return;
}

Assistant:

void close_sound(void)
{
	if (0 == next_sound_id) return;	/* Never opened */

	/*
	 * Ask the platforms sound module to free resources for each
	 * sound
	 */
	if (hooks.unload_sound_hook) {
		int i;

		for (i = 0; i < next_sound_id; i++) {
			hooks.unload_sound_hook(&sounds[i]);
			string_free(sounds[i].name);
		}
	}

	mem_free(sounds);
	sounds = NULL;
	next_sound_id = 0;

	/* Close the platform's sound module */
	if (hooks.close_audio_hook) {
		hooks.close_audio_hook();
	}
}